

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
Imf_3_4::CompositeDeepScanLine::readPixels(CompositeDeepScanLine *this,int start,int end)

{
  value_type vVar1;
  size_type sVar2;
  size_type sVar3;
  Header *pHVar4;
  reference ppHVar5;
  reference pvVar6;
  reference pvVar7;
  ArgExc *this_00;
  reference this_01;
  reference pvVar8;
  reference this_02;
  reference this_03;
  reference ppfVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  *pointers_00;
  reference ppcVar11;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int y;
  TaskGroup g;
  size_t i_4;
  vector<const_char_*,_std::allocator<const_char_*>_> names;
  size_t j_3;
  size_t i_3;
  size_t part;
  size_t pixel;
  int64_t offset;
  size_t channel_1;
  size_t channel;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  samples;
  size_t j_2;
  size_t ptr;
  int64_t overall_sample_count;
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_sources;
  vector<unsigned_int,_std::allocator<unsigned_int>_> total_sizes;
  size_t total_pixels;
  size_t total_width;
  size_t j_1;
  size_t i_2;
  size_t i_1;
  size_t j;
  size_t i;
  vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_> headers;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  pointers;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  counts;
  vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_> framebuffers;
  size_t parts;
  DeepFrameBuffer *in_stack_fffffffffffffcc8;
  undefined4 uVar12;
  DeepScanLineInputPart *in_stack_fffffffffffffcd0;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffcd8;
  Data *in_stack_fffffffffffffce0;
  TaskGroup *in_stack_fffffffffffffce8;
  LineCompositeTask *in_stack_fffffffffffffcf0;
  DeepFrameBuffer *in_stack_fffffffffffffd08;
  DeepScanLineInputFile *in_stack_fffffffffffffd10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *num_sources_00;
  DeepScanLineInputFile *in_stack_fffffffffffffd20;
  int local_1cc;
  TaskGroup local_1c8 [8];
  ulong local_1c0;
  undefined1 local_1b1 [25];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  undefined8 in_stack_fffffffffffffe88;
  Header *in_stack_fffffffffffffe90;
  ulong uVar13;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  *in_stack_fffffffffffffe98;
  ulong uVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffea0;
  DeepFrameBuffer *in_stack_fffffffffffffea8;
  Data *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  size_type local_138;
  long local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  vector<const_char_*,_std::allocator<const_char_*>_> local_100;
  ulong local_e8;
  int local_e0;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  size_type local_c0;
  ulong local_b8;
  ulong local_b0;
  vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_> local_a0;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  local_80;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_60 [2];
  vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_> local_30;
  ulong local_18;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  sVar2 = std::
          vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
          ::size(*(vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                   **)(in_RDI + 8));
  sVar3 = std::
          vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
          ::size((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18));
  local_18 = sVar2 + sVar3;
  std::allocator<Imf_3_4::DeepFrameBuffer>::allocator
            ((allocator<Imf_3_4::DeepFrameBuffer> *)0x17fd21);
  std::vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>::vector
            ((vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_> *)
             in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8,
             (allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<Imf_3_4::DeepFrameBuffer>::~allocator
            ((allocator<Imf_3_4::DeepFrameBuffer> *)0x17fd4d);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x17fd72);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8,
           (allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x17fd9e);
  std::
  allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>
               *)0x17fdc3);
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
            *)in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8,
           (allocator_type *)in_stack_fffffffffffffce0);
  std::
  allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>
                *)0x17fdef);
  std::allocator<const_Imf_3_4::Header_*>::allocator((allocator<const_Imf_3_4::Header_*> *)0x17fe14)
  ;
  std::vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>::vector
            ((vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_> *)
             in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8,
             (allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<const_Imf_3_4::Header_*>::~allocator
            ((allocator<const_Imf_3_4::Header_*> *)0x17fe40);
  for (local_b0 = 0; uVar14 = local_b0,
      sVar2 = std::
              vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
              ::size(*(vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                       **)(in_RDI + 8)), uVar14 < sVar2; local_b0 = local_b0 + 1) {
    std::vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
    ::operator[](*(vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                   **)(in_RDI + 8),local_b0);
    pHVar4 = DeepScanLineInputFile::header(in_stack_fffffffffffffd20);
    ppHVar5 = std::vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>::
              operator[](&local_a0,local_b0);
    *ppHVar5 = pHVar4;
  }
  for (local_b8 = 0; uVar14 = local_b8,
      sVar2 = std::
              vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
              ::size((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                      *)(*(long *)(in_RDI + 8) + 0x18)), uVar14 < sVar2; local_b8 = local_b8 + 1) {
    std::vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
    ::operator[]((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18),local_b8);
    pHVar4 = DeepScanLineInputPart::header((DeepScanLineInputPart *)0x17fffc);
    ppHVar5 = std::vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>::
              operator[](&local_a0,local_b0 + local_b8);
    *ppHVar5 = pHVar4;
  }
  for (local_c0 = 0; local_c0 < local_18; local_c0 = local_c0 + 1) {
    std::vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>::operator[]
              (&local_30,local_c0);
    uVar12 = (undefined4)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[](local_60,local_c0);
    std::
    vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
    ::operator[](&local_80,local_c0);
    std::vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>::operator[]
              (&local_a0,local_c0);
    in_stack_fffffffffffffcc8 = (DeepFrameBuffer *)CONCAT44(uVar12,local_10);
    Data::handleDeepFrameBuffer
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffec0);
  }
  for (local_c8 = 0; uVar14 = local_c8,
      sVar2 = std::
              vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
              ::size(*(vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                       **)(in_RDI + 8)), uVar14 < sVar2; local_c8 = local_c8 + 1) {
    std::vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
    ::operator[](*(vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                   **)(in_RDI + 8),local_c8);
    std::vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>::operator[]
              (&local_30,local_c8);
    DeepScanLineInputFile::setFrameBuffer(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    std::vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
    ::operator[](*(vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                   **)(in_RDI + 8),local_c8);
    DeepScanLineInputFile::readPixelSampleCounts
              ((DeepScanLineInputFile *)in_stack_fffffffffffffcf0,
               (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),(int)in_stack_fffffffffffffce8);
  }
  for (local_d0 = 0; uVar14 = local_d0,
      sVar2 = std::
              vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
              ::size((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                      *)(*(long *)(in_RDI + 8) + 0x18)), uVar14 < sVar2; local_d0 = local_d0 + 1) {
    std::vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
    ::operator[]((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18),local_d0);
    std::vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>::operator[]
              (&local_30,local_c8 + local_d0);
    DeepScanLineInputPart::setFrameBuffer(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    std::vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
    ::operator[]((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18),local_d0);
    DeepScanLineInputPart::readPixelSampleCounts
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (int)in_stack_fffffffffffffcc8);
  }
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(in_stack_fffffffffffffcd8);
  local_d8 = (long)(local_e0 + 1);
  local_e8 = local_d8 * ((local_10 - local_c) + 1);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x180398);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcf0,
             (size_type)in_stack_fffffffffffffce8,(allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1803c4);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1803e9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcf0,
             (size_type)in_stack_fffffffffffffce8,(allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x180415);
  local_130 = 0;
  for (local_138 = 0; local_138 < local_e8; local_138 = local_138 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_100,local_138)
    ;
    *pvVar6 = 0;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_120,local_138);
    *pvVar6 = 0;
    for (sVar2 = 0; sVar2 < local_18; sVar2 = sVar2 + 1) {
      pvVar7 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](local_60,sVar2);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar7,local_138);
      vVar1 = *pvVar6;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_100,
                          local_138);
      *pvVar6 = vVar1 + *pvVar6;
      pvVar7 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](local_60,sVar2);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar7,local_138);
      if (*pvVar6 != 0) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_120,local_138);
        *pvVar6 = *pvVar6 + 1;
      }
    }
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_100,local_138)
    ;
    local_130 = (ulong)*pvVar6 + local_130;
  }
  if ((0 < (anonymous_namespace)::maximumSampleCount) &&
     ((anonymous_namespace)::maximumSampleCount < local_130)) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc
              (this_00,
               "Cannot composite scanline: total sample count on scanline exceeds limit set by CompositeDeepScanLine::setMaximumSampleCount()"
              );
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(*(long *)(in_RDI + 8) + 0xb0));
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1806b2);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8,
           (allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1806db);
  uVar14 = 0;
  while (uVar13 = uVar14,
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(*(long *)(in_RDI + 8) + 0xb0)), uVar14 < sVar2) {
    if ((uVar13 != 1) || ((*(byte *)(*(long *)(in_RDI + 8) + 0x60) & 1) != 0)) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)&stack0xfffffffffffffea8,uVar13);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcf0,
                 (size_type)in_stack_fffffffffffffce8);
    }
    uVar14 = uVar13 + 1;
  }
  uVar14 = 0;
  while (uVar13 = uVar14,
        sVar2 = std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        *)&stack0xfffffffffffffea8), uVar14 < sVar2) {
    if ((uVar13 != 1) || ((*(byte *)(*(long *)(in_RDI + 8) + 0x60) & 1) != 0)) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)&stack0xfffffffffffffea8,uVar13);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcf0,
                 (size_type)in_stack_fffffffffffffce8);
      sVar2 = 0;
      for (local_180 = 0; local_180 < local_e8; local_180 = local_180 + 1) {
        for (local_188 = 0; local_188 < local_18 && (long)sVar2 < local_130;
            local_188 = local_188 + 1) {
          this_01 = std::
                    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  *)&stack0xfffffffffffffea8,uVar13);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](this_01,sVar2);
          this_02 = std::
                    vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                    ::operator[](&local_80,local_188);
          this_03 = std::
                    vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                    ::operator[](this_02,uVar13);
          ppfVar9 = std::vector<float_*,_std::allocator<float_*>_>::operator[](this_03,local_180);
          *ppfVar9 = pvVar8;
          pvVar7 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[](local_60,local_188);
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (pvVar7,local_180);
          sVar2 = *pvVar6 + sVar2;
        }
      }
    }
    uVar14 = uVar13 + 1;
  }
  for (local_190 = 0; uVar14 = local_190,
      sVar2 = std::
              vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
              ::size(*(vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                       **)(in_RDI + 8)), uVar14 < sVar2; local_190 = local_190 + 1) {
    std::vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
    ::operator[](*(vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                   **)(in_RDI + 8),local_190);
    DeepScanLineInputFile::readPixels
              ((DeepScanLineInputFile *)in_stack_fffffffffffffcf0,
               (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),(int)in_stack_fffffffffffffce8);
  }
  local_198 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  while (num_sources_00 = local_198,
        pvVar10 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::
                  vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                  ::size((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                          *)(*(long *)(in_RDI + 8) + 0x18)), num_sources_00 < pvVar10) {
    std::vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
    ::operator[]((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x18),(size_type)local_198);
    DeepScanLineInputPart::readPixels
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
               (int)in_stack_fffffffffffffcc8);
    local_198 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                ((long)&(local_198->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  pointers_00 = (vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                 *)std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(*(long *)(in_RDI + 8) + 0xb0));
  pvVar10 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b1;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x180ad8);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffcf0,
             (size_type)in_stack_fffffffffffffce8,(allocator_type *)in_stack_fffffffffffffce0);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x180afe);
  for (local_1c0 = 0; uVar14 = local_1c0,
      sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_1b1 + 1)),
      uVar14 < sVar2; local_1c0 = local_1c0 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(*(long *)(in_RDI + 8) + 0xb0),local_1c0);
    in_stack_fffffffffffffcf0 = (LineCompositeTask *)std::__cxx11::string::c_str();
    ppcVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_1b1 + 1),
                          local_1c0);
    *ppcVar11 = (value_type)in_stack_fffffffffffffcf0;
  }
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x60) & 1) == 0) {
    ppcVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_1b1 + 1),0);
    in_stack_fffffffffffffce8 = (TaskGroup *)*ppcVar11;
    ppcVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_1b1 + 1),1);
    *ppcVar11 = (value_type)in_stack_fffffffffffffce8;
  }
  IlmThread_3_4::TaskGroup::TaskGroup(local_1c8);
  for (local_1cc = local_c; local_1cc <= local_10; local_1cc = local_1cc + 1) {
    in_stack_fffffffffffffce0 = (Data *)operator_new(0x40);
    anon_unknown_0::LineCompositeTask::LineCompositeTask
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
               (int)((ulong)&local_120 >> 0x20),(int)&local_120,&local_100,pointers_00,pvVar10,
               num_sources_00);
    IlmThread_3_4::ThreadPool::addGlobalTask((Task *)in_stack_fffffffffffffce0);
  }
  IlmThread_3_4::TaskGroup::~TaskGroup(local_1c8);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffce0);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)in_stack_fffffffffffffce0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffce0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffce0);
  std::vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_>::~vector
            ((vector<const_Imf_3_4::Header_*,_std::allocator<const_Imf_3_4::Header_*>_> *)
             in_stack_fffffffffffffce0);
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
             *)in_stack_fffffffffffffce0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_stack_fffffffffffffce0);
  std::vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_>::~vector
            ((vector<Imf_3_4::DeepFrameBuffer,_std::allocator<Imf_3_4::DeepFrameBuffer>_> *)
             in_stack_fffffffffffffce0);
  return;
}

Assistant:

void
CompositeDeepScanLine::readPixels (int start, int end)
{
    size_t parts =
        _Data->_file.size () + _Data->_part.size (); // total of files+parts

    vector<DeepFrameBuffer>      framebuffers (parts);
    vector<vector<unsigned int>> counts (parts);

    //
    // for each part, a pointer to an array of channels
    //
    vector<vector<vector<float*>>> pointers (parts);
    vector<const Header*>          headers (parts);

    {
        size_t i;
        for (i = 0; i < _Data->_file.size (); i++)
        {
            headers[i] = &_Data->_file[i]->header ();
        }

        for (size_t j = 0; j < _Data->_part.size (); j++)
        {
            headers[i + j] = &_Data->_part[j]->header ();
        }
    }

    for (size_t i = 0; i < parts; i++)
    {
        _Data->handleDeepFrameBuffer (
            framebuffers[i], counts[i], pointers[i], *headers[i], start, end);
    }

    //
    // set frame buffers and read scanlines from all parts
    // TODO what happens if SCANLINE not in data window?
    //

    {
        size_t i = 0;
        for (i = 0; i < _Data->_file.size (); i++)
        {
            _Data->_file[i]->setFrameBuffer (framebuffers[i]);
            _Data->_file[i]->readPixelSampleCounts (start, end);
        }
        for (size_t j = 0; j < _Data->_part.size (); j++)
        {
            _Data->_part[j]->setFrameBuffer (framebuffers[i + j]);
            _Data->_part[j]->readPixelSampleCounts (start, end);
        }
    }

    //
    //  total width
    //

    size_t               total_width  = _Data->_dataWindow.size ().x + 1;
    size_t               total_pixels = total_width * (end - start + 1);
    vector<unsigned int> total_sizes (total_pixels);
    vector<unsigned int> num_sources (
        total_pixels); //number of parts with non-zero sample count

    int64_t overall_sample_count =
        0; // sum of all samples in all images between start and end

    //
    // accumulate pixel counts
    //
    for (size_t ptr = 0; ptr < total_pixels; ptr++)
    {
        total_sizes[ptr] = 0;
        num_sources[ptr] = 0;
        for (size_t j = 0; j < parts; j++)
        {
            total_sizes[ptr] += counts[j][ptr];
            if (counts[j][ptr] > 0) num_sources[ptr]++;
        }
        overall_sample_count += total_sizes[ptr];
    }

    if (maximumSampleCount > 0 && overall_sample_count > maximumSampleCount)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Cannot composite scanline: total sample count on scanline exceeds "
            "limit set by CompositeDeepScanLine::setMaximumSampleCount()");
    }

    //
    // allocate arrays for pixel data
    // samples array accessed as in pixels[channel][sample]
    //

    vector<vector<float>> samples (_Data->_channels.size ());

    for (size_t channel = 0; channel < _Data->_channels.size (); channel++)
    {
        if (channel != 1 || _Data->_zback)
        {
            samples[channel].resize (overall_sample_count);
        }
    }

    for (size_t channel = 0; channel < samples.size (); channel++)
    {

        if (channel != 1 || _Data->_zback)
        {

            samples[channel].resize (overall_sample_count);

            //
            // allocate pointers for channel data
            //

            int64_t offset = 0;

            for (size_t pixel = 0; pixel < total_pixels; pixel++)
            {
                for (size_t part = 0;
                     part < parts && offset < overall_sample_count;
                     part++)
                {
                    pointers[part][channel][pixel] = &samples[channel][offset];
                    offset += counts[part][pixel];
                }
            }
        }
    }

    //
    // read data
    //

    for (size_t i = 0; i < _Data->_file.size (); i++)
    {
        _Data->_file[i]->readPixels (start, end);
    }
    for (size_t j = 0; j < _Data->_part.size (); j++)
    {
        _Data->_part[j]->readPixels (start, end);
    }

    //
    // composite pixels and write back to framebuffer
    //

    // turn vector of strings into array of char *
    // and make sure 'ZBack' channel is correct
    vector<const char*> names (_Data->_channels.size ());
    for (size_t i = 0; i < names.size (); i++)
    {
        names[i] = _Data->_channels[i].c_str ();
    }

    if (!_Data->_zback)
        names[1] = names[0]; // no zback channel, so make it point to z

    TaskGroup g;
    for (int y = start; y <= end; y++)
    {
        ThreadPool::addGlobalTask (new LineCompositeTask (
            &g,
            _Data,
            y,
            start,
            &names,
            &pointers,
            &total_sizes,
            &num_sources));
    } //next row
}